

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::CAPIRulesVector::CAPIRulesVector
          (CAPIRulesVector *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  bool bVar1;
  size_type sVar2;
  reference ppRVar3;
  CAPIBuildKey *this_00;
  reference ppCVar4;
  undefined1 local_58 [8];
  BuildKey key;
  Rule *rule;
  __normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
  local_28;
  const_iterator it;
  int idx;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items_local;
  CAPIRulesVector *this_local;
  
  sVar2 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::size(items);
  std::allocator<(anonymous_namespace)::CAPIBuildKey_*>::allocator
            ((allocator<(anonymous_namespace)::CAPIBuildKey_*> *)((long)&it._M_current + 7));
  std::
  vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
  ::vector(&this->rules,sVar2,(allocator_type *)((long)&it._M_current + 7));
  std::allocator<(anonymous_namespace)::CAPIBuildKey_*>::~allocator
            ((allocator<(anonymous_namespace)::CAPIBuildKey_*> *)((long)&it._M_current + 7));
  it._M_current._0_4_ = 0;
  local_28._M_current =
       (Rule **)std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::begin
                          (items);
  while( true ) {
    rule = (Rule *)std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::end
                             (items);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
                        *)&rule);
    if (!bVar1) break;
    ppRVar3 = __gnu_cxx::
              __normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
              ::operator*(&local_28);
    key.key.key.field_2._8_8_ = *ppRVar3;
    llbuild::buildsystem::BuildKey::fromData
              ((BuildKey *)local_58,&((Rule *)key.key.key.field_2._8_8_)->key);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    CAPIBuildKey::CAPIBuildKey(this_00,(BuildKey *)local_58);
    sVar2 = (size_type)(int)it._M_current;
    it._M_current._0_4_ = (int)it._M_current + 1;
    ppCVar4 = std::
              vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
              ::operator[](&this->rules,sVar2);
    *ppCVar4 = this_00;
    llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)local_58);
    __gnu_cxx::
    __normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

CAPIRulesVector(const std::vector<core::Rule*>& items) : rules(items.size()) {
      int idx = 0;

      for (std::vector<core::Rule*>::const_iterator it = items.begin(); it != items.end(); ++it) {
        core::Rule* rule = *it;
        auto key = BuildKey::fromData(rule->key);
        rules[idx++] = new CAPIBuildKey(key);
      }
    }